

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O1

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,BlockStatement *stmt)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  StatementBlockSymbol *pSVar4;
  group_type_pointer pgVar5;
  value_type_pointer ppVar6;
  Statement *this_00;
  size_type sVar7;
  pointer piVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  value_type *elements_1;
  BlockStatement *pBVar18;
  ulong hash;
  Statement **ppSVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  iterator pos;
  try_emplace_args_t local_a9;
  StatementSyntax *local_a8;
  BlockStatement *local_a0;
  BlockStatement *local_98;
  StatementBlockSymbol *local_90;
  Statement *stmtPtr;
  size_type local_80;
  group_type_pointer local_78;
  Statement local_70;
  locator res;
  
  pSVar4 = stmt->blockSymbol;
  if (pSVar4 != (StatementBlockSymbol *)0x0) {
    local_a8 = (StatementSyntax *)&this->disableBranches;
    stmtPtr = &local_70;
    local_80 = 0;
    local_78 = (group_type_pointer)0xa;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = pSVar4;
    hash = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar13 = hash >> ((byte)(this->disableBranches).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
                            .arrays.groups_size_index & 0x3f);
    pgVar5 = (this->disableBranches).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
             .arrays.groups_;
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    ppVar6 = (this->disableBranches).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
             .arrays.elements_;
    local_98 = (BlockStatement *)
               (this->disableBranches).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
               .arrays.groups_size_mask;
    pBVar18 = (BlockStatement *)0x0;
    uVar22 = uVar13;
    do {
      local_a0 = pBVar18;
      pgVar2 = pgVar5 + uVar22;
      uVar25 = (uchar)uVar3;
      auVar29[0] = -(pgVar2->m[0].n == uVar25);
      uVar26 = (uchar)((uint)uVar3 >> 8);
      auVar29[1] = -(pgVar2->m[1].n == uVar26);
      uVar27 = (uchar)((uint)uVar3 >> 0x10);
      auVar29[2] = -(pgVar2->m[2].n == uVar27);
      uVar28 = (uchar)((uint)uVar3 >> 0x18);
      auVar29[3] = -(pgVar2->m[3].n == uVar28);
      auVar29[4] = -(pgVar2->m[4].n == uVar25);
      auVar29[5] = -(pgVar2->m[5].n == uVar26);
      auVar29[6] = -(pgVar2->m[6].n == uVar27);
      auVar29[7] = -(pgVar2->m[7].n == uVar28);
      auVar29[8] = -(pgVar2->m[8].n == uVar25);
      auVar29[9] = -(pgVar2->m[9].n == uVar26);
      auVar29[10] = -(pgVar2->m[10].n == uVar27);
      auVar29[0xb] = -(pgVar2->m[0xb].n == uVar28);
      auVar29[0xc] = -(pgVar2->m[0xc].n == uVar25);
      auVar29[0xd] = -(pgVar2->m[0xd].n == uVar26);
      auVar29[0xe] = -(pgVar2->m[0xe].n == uVar27);
      auVar29[0xf] = -(pgVar2->m[0xf].n == uVar28);
      for (uVar16 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe); local_90 = pSVar4
          , uVar16 != 0; uVar16 = uVar16 - 1 & uVar16) {
        uVar9 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        if (pSVar4 == (StatementBlockSymbol *)ppVar6[uVar22 * 0xf + (ulong)uVar9].first) {
          if (ppVar6 + uVar22 * 0xf + (ulong)uVar9 != (value_type_pointer)0x0) goto LAB_00207137;
          goto LAB_002070ed;
        }
      }
      if ((pgVar5[uVar22].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
      pBVar18 = (BlockStatement *)((long)&(local_a0->super_Statement).kind + 1);
      uVar22 = (long)&(local_a0->super_Statement).kind + uVar22 + 1 & (ulong)local_98;
    } while (pBVar18 <= local_98);
LAB_002070ed:
    if ((this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
        .size_ctrl.size <
        (this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
                       *)local_a8,(arrays_type *)local_a8,uVar13,hash,&local_a9,(Symbol **)&local_90
                 ,(SmallVector<int,_10UL> *)&stmtPtr);
      psVar1 = &(this->disableBranches).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
                       *)local_a8,hash,&local_a9,(Symbol **)&local_90,
                 (SmallVector<int,_10UL> *)&stmtPtr);
    }
LAB_00207137:
    if (stmtPtr != &local_70) {
      operator_delete(stmtPtr);
    }
  }
  if (stmt->blockKind == Sequential) {
    ast::Statement::visit<TestAnalysis&>(stmt->body,(TestAnalysis *)this);
  }
  else {
    stmtPtr = stmt->body;
    if (stmtPtr->kind == List) {
      ppSVar19 = *(Statement ***)(stmtPtr + 1);
      local_a8 = stmtPtr[1].syntax;
    }
    else {
      ppSVar19 = &stmtPtr;
      local_a8 = (StatementSyntax *)0x1;
    }
    local_98 = stmt;
    if (local_a8 == (StatementSyntax *)0x0) {
      lVar15 = 0;
    }
    else {
      lVar14 = (long)local_a8 * 8;
      lVar15 = 0;
      lVar23 = 0;
      do {
        if ((*(Statement **)((long)ppSVar19 + lVar23))->kind != VariableDeclaration) break;
        ast::Statement::visit<TestAnalysis&>
                  (*(Statement **)((long)ppSVar19 + lVar23),(TestAnalysis *)this);
        lVar15 = lVar15 + 1;
        bVar24 = lVar14 + -8 != lVar23;
        lVar23 = lVar23 + 8;
      } while (bVar24);
    }
    stmt = local_98;
    iVar17 = this->state;
    local_a0 = (BlockStatement *)((long)local_a8 - lVar15);
    iVar21 = iVar17;
    if (local_a0 != (BlockStatement *)0x0) {
      lVar15 = lVar15 << 3;
      local_a8 = (StatementSyntax *)((long)local_a8 << 3);
      iVar20 = iVar17;
      do {
        this_00 = *(Statement **)((long)ppSVar19 + lVar15);
        this->isStateSplit = false;
        this->state = iVar17;
        this->stateWhenTrue = 0;
        this->stateWhenFalse = 0;
        ast::Statement::visit<TestAnalysis&>(this_00,(TestAnalysis *)this);
        if (stmt->blockKind == JoinAll) {
          iVar12 = this->state;
LAB_00207254:
          bVar24 = iVar12 < iVar21;
          iVar21 = iVar20;
          if (bVar24) {
            iVar21 = iVar12;
            iVar20 = iVar12;
          }
        }
        else if (stmt->blockKind != JoinNone) {
          iVar12 = this->state;
          if (local_a0 == (BlockStatement *)0x1) goto LAB_00207254;
          iVar21 = iVar21 + iVar12;
          iVar20 = iVar21;
        }
        lVar15 = lVar15 + 8;
      } while (local_a8 != (StatementSyntax *)lVar15);
    }
    this->isStateSplit = false;
    this->state = iVar21;
    this->stateWhenTrue = 0;
    this->stateWhenFalse = 0;
  }
  pSVar4 = stmt->blockSymbol;
  if (pSVar4 == (StatementBlockSymbol *)0x0) {
    return;
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ = pSVar4;
  uVar13 = SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar22 = uVar13 >> ((byte)(this->disableBranches).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  local_a0 = (BlockStatement *)&this->disableBranches;
  pgVar5 = (this->disableBranches).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
           .arrays.groups_;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar13 & 0xff];
  ppVar6 = (this->disableBranches).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
           .arrays.elements_;
  local_a8 = (StatementSyntax *)
             (this->disableBranches).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
             .arrays.groups_size_mask;
  lVar15 = 0;
  do {
    pgVar2 = pgVar5 + uVar22;
    uVar25 = (uchar)uVar3;
    auVar30[0] = -(pgVar2->m[0].n == uVar25);
    uVar26 = (uchar)((uint)uVar3 >> 8);
    auVar30[1] = -(pgVar2->m[1].n == uVar26);
    uVar27 = (uchar)((uint)uVar3 >> 0x10);
    auVar30[2] = -(pgVar2->m[2].n == uVar27);
    uVar28 = (uchar)((uint)uVar3 >> 0x18);
    auVar30[3] = -(pgVar2->m[3].n == uVar28);
    auVar30[4] = -(pgVar2->m[4].n == uVar25);
    auVar30[5] = -(pgVar2->m[5].n == uVar26);
    auVar30[6] = -(pgVar2->m[6].n == uVar27);
    auVar30[7] = -(pgVar2->m[7].n == uVar28);
    auVar30[8] = -(pgVar2->m[8].n == uVar25);
    auVar30[9] = -(pgVar2->m[9].n == uVar26);
    auVar30[10] = -(pgVar2->m[10].n == uVar27);
    auVar30[0xb] = -(pgVar2->m[0xb].n == uVar28);
    auVar30[0xc] = -(pgVar2->m[0xc].n == uVar25);
    auVar30[0xd] = -(pgVar2->m[0xd].n == uVar26);
    auVar30[0xe] = -(pgVar2->m[0xe].n == uVar27);
    auVar30[0xf] = -(pgVar2->m[0xf].n == uVar28);
    for (uVar16 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe); uVar16 != 0;
        uVar16 = uVar16 - 1 & uVar16) {
      uVar9 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
        }
      }
      uVar13 = (ulong)uVar9;
      if (pSVar4 == (StatementBlockSymbol *)ppVar6[uVar22 * 0xf + uVar13].first) {
        pos.p_ = (table_element_pointer)(pgVar5[uVar22].m + uVar13);
        sVar7 = ppVar6[uVar22 * 0xf + uVar13].second.super_SmallVectorBase<int>.len;
        if (sVar7 != 0) {
          piVar8 = ppVar6[uVar22 * 0xf + uVar13].second.super_SmallVectorBase<int>.data_;
          iVar17 = this->state;
          lVar15 = 0;
          do {
            iVar17 = iVar17 + *(int *)((long)piVar8 + lVar15);
            this->state = iVar17;
            lVar15 = lVar15 + 4;
          } while (sVar7 << 2 != lVar15);
        }
        pos.pc_ = (char_pointer)local_a0;
        boost::unordered::detail::foa::
        table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
        ::erase<false,_nullptr>
                  ((table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                    *)&stmtPtr,pos);
        return;
      }
    }
    lVar14 = uVar22 + lVar15;
    lVar15 = lVar15 + 1;
    uVar22 = lVar14 + 1U & (ulong)local_a8;
  } while( true );
}

Assistant:

void visitStmt(const BlockStatement& stmt) {
        // This block could be the target of a disable statement.
        if (stmt.blockSymbol) {
            auto [it, inserted] = disableBranches.try_emplace(stmt.blockSymbol,
                                                              SmallVector<TState>{});
            SLANG_ASSERT(inserted);
        }

        if (stmt.blockKind == StatementBlockKind::Sequential) {
            visit(stmt.body);
        }
        else {
            auto stmtPtr = &stmt.body;
            auto statements = stmt.body.kind == StatementKind::List
                                  ? stmt.body.as<StatementList>().list
                                  : std::span(&stmtPtr, 1);
            size_t numLocalDecls = 0;
            for (auto s : statements) {
                // Variable declaration initializers happen before
                // we fork the remaining statements.
                if (s->kind == StatementKind::VariableDeclaration) {
                    visit(*s);
                    numLocalDecls++;
                }
                else {
                    break;
                }
            }
            statements = statements.subspan(numLocalDecls);

            // Each remaining statement is executed in parallel.
            auto currState = (DERIVED).copyState(state);
            auto finalState = std::move(state);
            for (auto s : statements) {
                setState((DERIVED).copyState(currState));
                visit(*s);

                switch (stmt.blockKind) {
                    case StatementBlockKind::JoinAny:
                        // If there's only one statement (a pathological case)
                        // then we can meet it; otherwise we must join since
                        // there is uncertainty about which path was taken.
                        if (statements.size() == 1)
                            (DERIVED).meetState(finalState, state);
                        else
                            (DERIVED).joinState(finalState, state);
                        break;
                    case StatementBlockKind::JoinAll:
                        // All paths must be taken, so we meet the states.
                        (DERIVED).meetState(finalState, state);
                        break;
                    case StatementBlockKind::JoinNone:
                        // No paths will be taken by the time the fork
                        // moves on so we discard this state.
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            setState(std::move(finalState));
        }

        // Once we're done with a block we remove it as a disable target.
        // A disable statement can target any block in the hierarchy but
        // we don't analyze the control flow implications for targets that
        // aren't part of the current execution stack.
        if (stmt.blockSymbol) {
            auto it = disableBranches.find(stmt.blockSymbol);
            SLANG_ASSERT(it != disableBranches.end());

            for (auto& branchState : it->second)
                (DERIVED).joinState(state, branchState);

            disableBranches.erase(it);
        }
    }